

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmLineA<(moira::Instr)66,(moira::Mode)12,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Int i;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    StrWriter::operator<<(str,".short ");
    i.raw._2_2_ = 0;
    i.raw._0_2_ = op;
    StrWriter::operator<<(str,i);
    return;
  }
  StrWriter::operator<<(str,"dc.w ");
  StrWriter::operator<<(str,(Tab)(str->tab).raw);
  StrWriter::operator<<(str,(UInt16)op);
  StrWriter::operator<<(str,"; opcode 1010");
  return;
}

Assistant:

void
Moira::dasmLineA(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << ".short " << Int{op};
            break;

        default:

            str << "dc.w " << str.tab << UInt16{op} << "; opcode 1010";
    }
}